

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O0

void __thiscall QPDFCrypto_openssl::QPDFCrypto_openssl(QPDFCrypto_openssl *this)

{
  EVP_MD_CTX *pEVar1;
  EVP_CIPHER_CTX *pEVar2;
  QPDFCrypto_openssl *this_local;
  
  QPDFCryptoImpl::QPDFCryptoImpl(&this->super_QPDFCryptoImpl);
  (this->super_QPDFCryptoImpl)._vptr_QPDFCryptoImpl =
       (_func_int **)&PTR__QPDFCrypto_openssl_00592bb0;
  pEVar1 = (EVP_MD_CTX *)EVP_MD_CTX_new();
  this->md_ctx = pEVar1;
  pEVar2 = EVP_CIPHER_CTX_new();
  this->cipher_ctx = (EVP_CIPHER_CTX *)pEVar2;
  this->md_out[0x30] = '\0';
  this->md_out[0x31] = '\0';
  this->md_out[0x32] = '\0';
  this->md_out[0x33] = '\0';
  this->md_out[0x34] = '\0';
  this->md_out[0x35] = '\0';
  this->md_out[0x36] = '\0';
  this->md_out[0x37] = '\0';
  this->md_out[0x38] = '\0';
  this->md_out[0x39] = '\0';
  this->md_out[0x3a] = '\0';
  this->md_out[0x3b] = '\0';
  this->md_out[0x3c] = '\0';
  this->md_out[0x3d] = '\0';
  this->md_out[0x3e] = '\0';
  this->md_out[0x3f] = '\0';
  this->md_out[0x20] = '\0';
  this->md_out[0x21] = '\0';
  this->md_out[0x22] = '\0';
  this->md_out[0x23] = '\0';
  this->md_out[0x24] = '\0';
  this->md_out[0x25] = '\0';
  this->md_out[0x26] = '\0';
  this->md_out[0x27] = '\0';
  this->md_out[0x28] = '\0';
  this->md_out[0x29] = '\0';
  this->md_out[0x2a] = '\0';
  this->md_out[0x2b] = '\0';
  this->md_out[0x2c] = '\0';
  this->md_out[0x2d] = '\0';
  this->md_out[0x2e] = '\0';
  this->md_out[0x2f] = '\0';
  this->md_out[0x10] = '\0';
  this->md_out[0x11] = '\0';
  this->md_out[0x12] = '\0';
  this->md_out[0x13] = '\0';
  this->md_out[0x14] = '\0';
  this->md_out[0x15] = '\0';
  this->md_out[0x16] = '\0';
  this->md_out[0x17] = '\0';
  this->md_out[0x18] = '\0';
  this->md_out[0x19] = '\0';
  this->md_out[0x1a] = '\0';
  this->md_out[0x1b] = '\0';
  this->md_out[0x1c] = '\0';
  this->md_out[0x1d] = '\0';
  this->md_out[0x1e] = '\0';
  this->md_out[0x1f] = '\0';
  this->md_out[0] = '\0';
  this->md_out[1] = '\0';
  this->md_out[2] = '\0';
  this->md_out[3] = '\0';
  this->md_out[4] = '\0';
  this->md_out[5] = '\0';
  this->md_out[6] = '\0';
  this->md_out[7] = '\0';
  this->md_out[8] = '\0';
  this->md_out[9] = '\0';
  this->md_out[10] = '\0';
  this->md_out[0xb] = '\0';
  this->md_out[0xc] = '\0';
  this->md_out[0xd] = '\0';
  this->md_out[0xe] = '\0';
  this->md_out[0xf] = '\0';
  EVP_MD_CTX_reset(this->md_ctx);
  EVP_CIPHER_CTX_reset(this->cipher_ctx);
  return;
}

Assistant:

QPDFCrypto_openssl::QPDFCrypto_openssl() :
    md_ctx(EVP_MD_CTX_new()),
    cipher_ctx(EVP_CIPHER_CTX_new())
{
    memset(md_out, 0, sizeof(md_out));
    EVP_MD_CTX_init(md_ctx);
    EVP_CIPHER_CTX_init(cipher_ctx);
}